

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ObservableEvents::Serialize(ObservableEvents *this,Message *msg)

{
  bool bVar1;
  reference this_00;
  Message *msg_00;
  void *data;
  size_t size;
  ObservableEvents_DataSourceInstanceStateChange *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
  *__range2;
  Message *msg_local;
  ObservableEvents *this_local;
  
  __end2 = std::
           vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
           ::begin(&this->instance_state_changes_);
  it = (ObservableEvents_DataSourceInstanceStateChange *)
       std::
       vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
       ::end(&this->instance_state_changes_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange_*,_std::vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>_>
                                     *)&it), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange_*,_std::vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>_>
              ::operator*(&__end2);
    msg_00 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    ObservableEvents_DataSourceInstanceStateChange::Serialize(this_00,msg_00);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange_*,_std::vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)(this->all_data_sources_started_ & 1));
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void ObservableEvents::Serialize(::protozero::Message* msg) const {
  // Field 1: instance_state_changes
  for (auto& it : instance_state_changes_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: all_data_sources_started
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, all_data_sources_started_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}